

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::findCompositeConstant
          (Builder *this,Op typeClass,Op opcode,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *comps,size_t numMembers)

{
  bool bVar1;
  Id IVar2;
  Op OVar3;
  int iVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  reference ppIVar7;
  const_reference pvVar8;
  Id local_68;
  int local_50;
  int op;
  Id IStack_44;
  bool mismatch;
  int local_40;
  byte local_39;
  int i;
  bool found;
  Instruction *constant;
  size_t numMembers_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *comps_local;
  Op local_18;
  Id typeId_local;
  Op opcode_local;
  Op typeClass_local;
  Builder *this_local;
  
  _i = (Instruction *)0x0;
  local_39 = 0;
  local_40 = 0;
  constant = (Instruction *)numMembers;
  numMembers_local = (size_t)comps;
  comps_local._4_4_ = typeId;
  local_18 = opcode;
  typeId_local = typeClass;
  _opcode_local = this;
  do {
    iVar4 = local_40;
    IStack_44 = typeId_local;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedConstants,&stack0xffffffffffffffbc);
    sVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar5);
    if ((int)sVar6 <= iVar4) {
LAB_006d7e99:
      if ((local_39 & 1) == 0) {
        local_68 = 0;
      }
      else {
        local_68 = spv::Instruction::getResultId(_i);
      }
      return local_68;
    }
    op = typeId_local;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedConstants,(key_type *)&op);
    ppIVar7 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar5,(long)local_40);
    _i = *ppIVar7;
    IVar2 = spv::Instruction::getTypeId(_i);
    if (((IVar2 == comps_local._4_4_) &&
        (OVar3 = spv::Instruction::getOpCode(_i), OVar3 == local_18)) &&
       (iVar4 = spv::Instruction::getNumOperands(_i), iVar4 == (int)constant)) {
      bVar1 = false;
      for (local_50 = 0; iVar4 = spv::Instruction::getNumOperands(_i), local_50 < iVar4;
          local_50 = local_50 + 1) {
        IVar2 = spv::Instruction::getIdOperand(_i,local_50);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)numMembers_local,
                            (long)local_50);
        if (IVar2 != *pvVar8) {
          bVar1 = true;
          break;
        }
      }
      if (!bVar1) {
        local_39 = 1;
        goto LAB_006d7e99;
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

Id Builder::findCompositeConstant(Op typeClass, Op opcode, Id typeId, const std::vector<Id>& comps, size_t numMembers)
{
    Instruction* constant = nullptr;
    bool found = false;
    for (int i = 0; i < (int)groupedConstants[typeClass].size(); ++i) {
        constant = groupedConstants[typeClass][i];

        if (constant->getTypeId() != typeId)
            continue;

        if (constant->getOpCode() != opcode) {
            continue;
        }

        if (constant->getNumOperands() != (int)numMembers)
            continue;

        // same contents?
        bool mismatch = false;
        for (int op = 0; op < constant->getNumOperands(); ++op) {
            if (constant->getIdOperand(op) != comps[op]) {
                mismatch = true;
                break;
            }
        }
        if (! mismatch) {
            found = true;
            break;
        }
    }

    return found ? constant->getResultId() : NoResult;
}